

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlFdRead(void *context,char *buffer,int len)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  
  iVar2 = *context;
  iVar5 = 0;
  while( true ) {
    if (len < 1) {
      return iVar5;
    }
    sVar3 = read(iVar2,buffer,(ulong)(uint)len);
    uVar1 = (uint)sVar3;
    if ((int)uVar1 < 0) break;
    if (uVar1 == 0) {
      return iVar5;
    }
    iVar5 = iVar5 + uVar1;
    buffer = buffer + (uVar1 & 0x7fffffff);
    len = len - uVar1;
  }
  if (0 < iVar5) {
    return iVar5;
  }
  piVar4 = __errno_location();
  iVar2 = xmlIOErr(*piVar4);
  return -iVar2;
}

Assistant:

static int
xmlFdRead(void *context, char *buffer, int len) {
    xmlFdIOCtxt *fdctxt = context;
    int fd = fdctxt->fd;
    int ret = 0;
    int bytes;

    while (len > 0) {
        bytes = read(fd, buffer, len);
        if (bytes < 0) {
            /*
             * If we already got some bytes, return them without
             * raising an error.
             */
            if (ret > 0)
                break;
            return(-xmlIOErr(errno));
        }
        if (bytes == 0)
            break;
        ret += bytes;
        buffer += bytes;
        len -= bytes;
    }

    return(ret);
}